

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileJsonObject(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken **ppNext;
  sxi32 sVar1;
  long lVar2;
  char *zFormat;
  sxu32 nLine;
  int iVar3;
  SyToken *pSVar4;
  _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *in_R8;
  SyToken *pSVar5;
  SyToken *pSVar6;
  
  ppNext = &pGen->pIn;
  pSVar5 = pGen->pIn;
  pGen->pIn = pSVar5 + 1;
  pSVar4 = pGen->pEnd + -1;
  pGen->pEnd = pSVar4;
  iVar3 = 0;
  pSVar5 = pSVar5 + 1;
  do {
    while ((pSVar6 = pSVar5 + 1, pSVar5 < pSVar4 && ((pSVar5->nType & 0x20000) != 0))) {
      *ppNext = pSVar6;
      pSVar5 = pSVar6;
    }
    sVar1 = jx9GetNextExpr(pSVar5,pSVar4,ppNext);
    if (sVar1 != 0) {
      jx9VmEmitInstr(pGen->pVm,6,iVar3 * 2,1,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    lVar2 = 0;
    do {
      pSVar4 = pSVar6;
      if (*ppNext <= pSVar4 + -1) {
        if ((pSVar4[-1].nType >> 0x14 & 1) == 0) {
          nLine = pSVar4[-1].nLine;
          zFormat = "JSON Object: Missing colon string \":\"";
          sVar1 = -1;
          goto LAB_00126397;
        }
        if (lVar2 == 0) {
          jx9GenCompileError(pGen,1,pSVar4[-1].nLine,"JSON Object: Missing entry key");
          pSVar5 = pSVar4;
        }
        goto LAB_00126328;
      }
      lVar2 = lVar2 + -0x20;
      pSVar6 = pSVar4 + 1;
    } while ((pSVar4[-1].nType >> 0x14 & 1) == 0);
    if (*ppNext <= pSVar4) {
      nLine = pSVar4[-1].nLine;
      zFormat = "JSON Object: Missing entry value";
      sVar1 = 1;
LAB_00126397:
      sVar1 = jx9GenCompileError(pGen,sVar1,nLine,zFormat);
      if (sVar1 == -10) {
        return -10;
      }
      return 0;
    }
    sVar1 = GenStateCompileJSONEntry(pGen,pSVar5,pSVar4 + -1,0x12692e,in_R8);
    pSVar5 = pSVar4;
    if (sVar1 == -10) {
      return -10;
    }
LAB_00126328:
    sVar1 = GenStateCompileJSONEntry(pGen,pSVar5,pGen->pIn,0,in_R8);
    if (sVar1 == -10) {
      return -10;
    }
    iVar3 = iVar3 + 1;
    pSVar5 = pGen->pIn;
    pSVar4 = pGen->pEnd;
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileJsonObject(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyToken *pKey, *pCur;
	sxi32 nPair = 0;
	sxi32 rc;

	pGen->pIn++; /* Jump the open querly braces '{'*/
	pGen->pEnd--;
	SXUNUSED(iCompileFlag); /* cc warning */
	for(;;){
		/* Jump leading commas */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
		pCur = pGen->pIn;
		if( SXRET_OK != jx9GetNextExpr(pGen->pIn, pGen->pEnd, &pGen->pIn) ){
			/* No more entry to process */
			break;
		}
		/* Compile the key */
		pKey = pCur;
		while( pCur < pGen->pIn ){
			if( pCur->nType & JX9_TK_COLON /*':'*/  ){
				break;
			}
			pCur++;
		}
		rc = SXERR_EMPTY;
		if( (pCur->nType & JX9_TK_COLON) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ABORT, pCur->nLine, "JSON Object: Missing colon string \":\"");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}

		if( pCur < pGen->pIn ){
			if( &pCur[1] >= pGen->pIn ){
				/* Missing value */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pCur->nLine, "JSON Object: Missing entry value");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				return SXRET_OK;
			}
			/* Compile the expression holding the key */
			rc = GenStateCompileJSONEntry(&(*pGen), pKey, pCur,
				EXPR_FLAG_RDONLY_LOAD                /* Do not create the variable if inexistant */, 
				GenStateJSONObjectKeyNodeValidator   /* Node validator callback */
				);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			pCur++; /* Jump the double colon ':'  */
		}else if( pKey == pCur ){
			/* Key is omitted, emit an error */
			jx9GenCompileError(&(*pGen),E_ERROR, pCur->nLine, "JSON Object: Missing entry key");
			pCur++; /* Jump the double colon ':'  */
		}else{
			/* Reset back the cursor and point to the entry value */
			pCur = pKey;
		}
		/* Compile indice value */
		rc = GenStateCompileJSONEntry(&(*pGen), pCur, pGen->pIn, EXPR_FLAG_RDONLY_LOAD/*Do not create the variable if inexistant*/,0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		nPair++;
	}
	/* Emit the load map instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD_MAP, nPair * 2, 1, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}